

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O0

String * axl::io::getDir(StringRef *filePath)

{
  size_t sVar1;
  String *in_RDI;
  size_t i;
  undefined7 in_stack_ffffffffffffffb8;
  C in_stack_ffffffffffffffbf;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffc0;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffc8;
  
  sVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::reverseFind
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,(size_t)in_RDI);
  if (sVar1 == 0xffffffffffffffff) {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (in_stack_ffffffffffffffc0,
               (C *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  else {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLeftSubString
              (in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffffc0,
             (StringRef *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x16d8bf);
  return in_RDI;
}

Assistant:

sl::String
getDir(const sl::StringRef& filePath) {
#if (_AXL_OS_WIN)
	char buffer[256];
	sl::String_w filePath_w(rc::BufKind_Stack, buffer, sizeof(buffer));
	filePath_w = filePath;

	wchar_t drive[4] = { 0 };
	wchar_t dir[1024] = { 0 };

	_wsplitpath_s(
		filePath_w,
		drive, countof(drive) - 1,
		dir, countof(dir) - 1,
		NULL, 0,
		NULL, 0
	);

	sl::String string = drive;
	string.append(dir);
	return string;

#elif (_AXL_OS_POSIX)
	size_t i = filePath.reverseFind('/');
	return i != -1 ? filePath.getLeftSubString(i + 1) : NULL;
#endif
}